

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O0

void __thiscall tcu::TestHierarchyIterator::next(TestHierarchyIterator *this)

{
  TestNode *this_00;
  CaseListFilter *pCVar1;
  bool bVar2;
  TestNodeType TVar3;
  State SVar4;
  int iVar5;
  reference this_01;
  char *pcVar6;
  size_type sVar7;
  reference ppTVar8;
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  *nodeStack;
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  *nodeStack_00;
  string local_b0;
  NodeIter local_90;
  TestNode *local_68;
  TestNode *childNode;
  int local_58;
  int numChildren;
  undefined1 local_48 [8];
  string nodePath;
  bool isLeaf;
  TestNode *node;
  NodeIter *iter;
  TestHierarchyIterator *this_local;
  
  do {
    bVar2 = std::
            vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
            ::empty(&this->m_sessionStack);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    this_01 = std::
              vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
              ::back(&this->m_sessionStack);
    this_00 = this_01->node;
    TVar3 = TestNode::getNodeType(this_00);
    nodePath.field_2._M_local_buf[0xf] = isTestNodeTypeExecutable(TVar3);
    SVar4 = NodeIter::getState(this_01);
    switch(SVar4) {
    case STATE_INIT:
      buildNodePath_abi_cxx11_
                ((string *)local_48,(TestHierarchyIterator *)&this->m_sessionStack,nodeStack);
      if ((nodePath.field_2._M_local_buf[0xf] & 1U) == 0) {
        pCVar1 = this->m_caseListFilter;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = CaseListFilter::checkTestGroupName(pCVar1,pcVar6);
        if (bVar2) goto LAB_012aa892;
LAB_012aa85f:
        std::
        vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
        ::pop_back(&this->m_sessionStack);
        local_58 = 4;
      }
      else {
        pCVar1 = this->m_caseListFilter;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = CaseListFilter::checkTestCaseName(pCVar1,pcVar6);
        if (!bVar2) goto LAB_012aa85f;
LAB_012aa892:
        std::__cxx11::string::operator=((string *)&this->m_nodePath,(string *)local_48);
        NodeIter::setState(this_01,STATE_ENTER);
        local_58 = 1;
      }
      std::__cxx11::string::~string((string *)local_48);
      if (local_58 == 1) {
        return;
      }
      break;
    case STATE_ENTER:
      if ((nodePath.field_2._M_local_buf[0xf] & 1U) != 0) {
        NodeIter::setState(this_01,STATE_LEAVE);
        return;
      }
      NodeIter::setState(this_01,STATE_TRAVERSE_CHILDREN);
      std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::clear(&this_01->children);
      TVar3 = TestNode::getNodeType(this_00);
      if (TVar3 == NODETYPE_ROOT) {
        TestNode::getChildren(this_00,&this_01->children);
      }
      else if (TVar3 == NODETYPE_PACKAGE) {
        (**this->m_inflater->_vptr_TestHierarchyInflater)
                  (this->m_inflater,this_00,&this_01->children);
      }
      else if (TVar3 == NODETYPE_GROUP) {
        (*this->m_inflater->_vptr_TestHierarchyInflater[2])
                  (this->m_inflater,this_00,&this_01->children);
      }
      break;
    case STATE_TRAVERSE_CHILDREN:
      sVar7 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                        (&this_01->children);
      childNode._4_4_ = (int)sVar7;
      iVar5 = this_01->curChildNdx + 1;
      this_01->curChildNdx = iVar5;
      if (iVar5 < childNode._4_4_) {
        ppTVar8 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                            (&this_01->children,(long)this_01->curChildNdx);
        local_68 = *ppTVar8;
        NodeIter::NodeIter(&local_90,local_68);
        std::
        vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
        ::push_back(&this->m_sessionStack,&local_90);
        NodeIter::~NodeIter(&local_90);
      }
      else {
        NodeIter::setState(this_01,STATE_LEAVE);
        TVar3 = TestNode::getNodeType(this_00);
        if (TVar3 != NODETYPE_ROOT) {
switchD_012aa7c7_default:
          return;
        }
      }
      break;
    case STATE_LEAVE:
      if (((nodePath.field_2._M_local_buf[0xf] & 1U) == 0) &&
         (TVar3 = TestNode::getNodeType(this_00), TVar3 != NODETYPE_ROOT)) {
        if (TVar3 == NODETYPE_PACKAGE) {
          (*this->m_inflater->_vptr_TestHierarchyInflater[1])(this->m_inflater,this_00);
        }
        else if (TVar3 == NODETYPE_GROUP) {
          (*this->m_inflater->_vptr_TestHierarchyInflater[3])(this->m_inflater,this_00);
        }
      }
      std::
      vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
      ::pop_back(&this->m_sessionStack);
      buildNodePath_abi_cxx11_
                (&local_b0,(TestHierarchyIterator *)&this->m_sessionStack,nodeStack_00);
      std::__cxx11::string::operator=((string *)&this->m_nodePath,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      break;
    default:
      goto switchD_012aa7c7_default;
    }
  } while( true );
}

Assistant:

void TestHierarchyIterator::next (void)
{
	while (!m_sessionStack.empty())
	{
		NodeIter&			iter		= m_sessionStack.back();
		TestNode* const		node		= iter.node;
		const bool			isLeaf		= isTestNodeTypeExecutable(node->getNodeType());

		switch (iter.getState())
		{
			case NodeIter::STATE_INIT:
			{
				const std::string nodePath = buildNodePath(m_sessionStack);

				// Return to parent if name doesn't match filter.
				if (!(isLeaf ? m_caseListFilter.checkTestCaseName(nodePath.c_str()) : m_caseListFilter.checkTestGroupName(nodePath.c_str())))
				{
					m_sessionStack.pop_back();
					break;
				}

				m_nodePath = nodePath;
				iter.setState(NodeIter::STATE_ENTER);
				return; // Yield enter event
			}

			case NodeIter::STATE_ENTER:
			{
				if (isLeaf)
				{
					iter.setState(NodeIter::STATE_LEAVE);
					return; // Yield leave event
				}
				else
				{
					iter.setState(NodeIter::STATE_TRAVERSE_CHILDREN);
					iter.children.clear();

					switch (node->getNodeType())
					{
						case NODETYPE_ROOT:		static_cast<TestPackageRoot*>(node)->getChildren(iter.children);				break;
						case NODETYPE_PACKAGE:	m_inflater.enterTestPackage(static_cast<TestPackage*>(node), iter.children);	break;
						case NODETYPE_GROUP:	m_inflater.enterGroupNode(static_cast<TestCaseGroup*>(node), iter.children);	break;
						default:
							DE_ASSERT(false);
					}
				}

				break;
			}

			case NodeIter::STATE_TRAVERSE_CHILDREN:
			{
				int numChildren = (int)iter.children.size();
				if (++iter.curChildNdx < numChildren)
				{
					// Push child to stack.
					TestNode* childNode = iter.children[iter.curChildNdx];
					m_sessionStack.push_back(NodeIter(childNode));
				}
				else
				{
					iter.setState(NodeIter::STATE_LEAVE);
					if (node->getNodeType() != NODETYPE_ROOT)
						return; // Yield leave event
				}

				break;
			}

			case NodeIter::STATE_LEAVE:
			{
				// Leave node.
				if (!isLeaf)
				{
					switch (node->getNodeType())
					{
						case NODETYPE_ROOT:		/* root is not de-initialized */								break;
						case NODETYPE_PACKAGE:	m_inflater.leaveTestPackage(static_cast<TestPackage*>(node));	break;
						case NODETYPE_GROUP:	m_inflater.leaveGroupNode(static_cast<TestCaseGroup*>(node));	break;
						default:
							DE_ASSERT(false);
					}
				}

				m_sessionStack.pop_back();
				m_nodePath = buildNodePath(m_sessionStack);
				break;
			}

			default:
				DE_ASSERT(false);
				return;
		}
	}

	DE_ASSERT(m_sessionStack.empty() && getState() == STATE_FINISHED);
}